

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CoverCrossSyntax::setChild(CoverCrossSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  CoverageIffClauseSyntax *pCVar3;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *pSVar4;
  NamedLabelSyntax *pNVar5;
  SyntaxNode *pSVar6;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar7;
  logic_error *this_00;
  Token TVar8;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 9) {
    switch(index) {
    case 0:
      pSVar6 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar6);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      pSVar6 = TokenOrSyntax::node(&child);
      if (pSVar6 == (SyntaxNode *)0x0) {
        pNVar5 = (NamedLabelSyntax *)0x0;
      }
      else {
        pSVar6 = TokenOrSyntax::node(&child);
        pNVar5 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar6);
      }
      this->label = pNVar5;
      break;
    case 2:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->cross).kind = TVar8.kind;
      (this->cross).field_0x2 = TVar8._2_1_;
      (this->cross).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->cross).rawLen = TVar8.rawLen;
      (this->cross).info = TVar8.info;
      break;
    case 3:
      pSVar6 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::
               as<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>>(pSVar6);
      (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->items).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->elements).size_;
      (this->items).elements.data_ = (pSVar4->elements).data_;
      (this->items).elements.size_ = sVar1;
      break;
    case 4:
      pSVar6 = TokenOrSyntax::node(&child);
      if (pSVar6 == (SyntaxNode *)0x0) {
        pCVar3 = (CoverageIffClauseSyntax *)0x0;
      }
      else {
        pSVar6 = TokenOrSyntax::node(&child);
        pCVar3 = SyntaxNode::as<slang::syntax::CoverageIffClauseSyntax>(pSVar6);
      }
      this->iff = pCVar3;
      break;
    case 5:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBrace).kind = TVar8.kind;
      (this->openBrace).field_0x2 = TVar8._2_1_;
      (this->openBrace).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->openBrace).rawLen = TVar8.rawLen;
      (this->openBrace).info = TVar8.info;
      break;
    case 6:
      pSVar6 = TokenOrSyntax::node(&child);
      pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar6);
      (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->members).super_SyntaxListBase.childCount = (pSVar7->super_SyntaxListBase).childCount;
      sVar1 = (pSVar7->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar7->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 7:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBrace).kind = TVar8.kind;
      (this->closeBrace).field_0x2 = TVar8._2_1_;
      (this->closeBrace).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->closeBrace).rawLen = TVar8.rawLen;
      (this->closeBrace).info = TVar8.info;
      break;
    case 8:
      TVar8 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->emptySemi).kind = TVar8.kind;
      (this->emptySemi).field_0x2 = TVar8._2_1_;
      (this->emptySemi).numFlags = (NumericTokenFlags)TVar8.numFlags.raw;
      (this->emptySemi).rawLen = TVar8.rawLen;
      (this->emptySemi).info = TVar8.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0xcb1);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CoverCrossSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 2: cross = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        case 4: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 5: openBrace = child.token(); return;
        case 6: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 7: closeBrace = child.token(); return;
        case 8: emptySemi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}